

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<fmt::v11::basic_string_view<char>const&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,
          basic_string_view<char> *args)

{
  format_args args_00;
  string_view fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffb10;
  logger *in_stack_fffffffffffffb18;
  logger *in_stack_fffffffffffffb20;
  basic_string_view<char> *in_stack_fffffffffffffb28;
  value<fmt::v11::context> *in_stack_fffffffffffffb30;
  basic_appender<char> *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb58;
  level_enum lvl_00;
  log_msg *in_stack_fffffffffffffb80;
  string_view_t in_stack_fffffffffffffb88;
  string_view_t in_stack_fffffffffffffb98;
  source_loc in_stack_fffffffffffffbb0;
  basic_string_view<char> local_3e8 [2];
  undefined2 uStack_3ba;
  log_msg *local_3b8;
  buffer<char> *local_350;
  char *local_348;
  size_t local_340;
  undefined8 local_338;
  char **local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  basic_appender<char> local_318 [4];
  buffer<char> local_2f8 [9];
  undefined1 local_1d2;
  byte local_1d1;
  undefined8 local_1d0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_e0;
  char *local_d8;
  size_t local_d0;
  char **local_c8;
  undefined8 *local_c0;
  
  lvl_00 = (level_enum)((ulong)in_RDI >> 0x20);
  local_1d0 = in_R8;
  local_1b8 = in_RDX;
  uStack_1b0 = in_RCX;
  local_1d1 = should_log(in_stack_fffffffffffffb18,
                         (level_enum)((ulong)in_stack_fffffffffffffb10 >> 0x20));
  local_1d2 = details::backtracer::enabled((backtracer *)0x15785b);
  if (((local_1d1 & 1) != 0) || ((bool)local_1d2)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffb10,(allocator<char> *)in_stack_fffffffffffffb08);
    ::fmt::v11::basic_appender<char>::basic_appender(local_318,local_2f8);
    local_328 = local_1b8;
    uStack_320 = uStack_1b0;
    local_e0 = local_1d0;
    ::fmt::v11::detail::value<fmt::v11::context>::value<fmt::v11::basic_string_view<char>,_char,_0>
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    local_348 = local_d8;
    local_340 = local_d0;
    local_c0 = &local_338;
    local_c8 = &local_348;
    local_338 = 0xd;
    fmt_00.size_ = local_d0;
    fmt_00.data_ = local_d8;
    args_00.desc_._4_4_ = in_stack_fffffffffffffb54;
    args_00.desc_._0_4_ = in_stack_fffffffffffffb50;
    args_00.field_1.values_ = in_stack_fffffffffffffb58.values_;
    local_330 = local_c8;
    local_350 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffb48,fmt_00,args_00);
    local_3b8 = in_stack_00000018;
    uStack_3ba = (undefined2)((ulong)in_stack_00000010 >> 0x30);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    s = ::fmt::v11::detail::buffer<char>::data(local_2f8);
    count = ::fmt::v11::detail::buffer<char>::size(local_2f8);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_3e8,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffbb0,in_stack_fffffffffffffb98,lvl_00,
               in_stack_fffffffffffffb88);
    log_it_(in_stack_fffffffffffffb20,local_3b8,SUB21((ushort)uStack_3ba >> 8,0),SUB21(uStack_3ba,0)
           );
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x157a89);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }